

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TagImport::~TagImport(TagImport *this)

{
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__TagImport_001a39c8;
  Tag::~Tag(&this->tag);
  Import::~Import((Import *)this);
  return;
}

Assistant:

explicit TagImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Tag>(), tag(name) {}